

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall ncnn::YoloDetectionOutput::create_pipeline(YoloDetectionOutput *this,Option *opt)

{
  Layer *pLVar1;
  undefined4 *in_RSI;
  long in_RDI;
  Option opt_cpu;
  ParamDict pd;
  undefined4 local_5e8;
  int in_stack_fffffffffffffa1c;
  undefined4 uVar2;
  undefined4 uVar3;
  ParamDict *in_stack_fffffffffffffa50;
  
  pLVar1 = create_layer(in_stack_fffffffffffffa1c);
  *(Layer **)(in_RDI + 0xd0) = pLVar1;
  ParamDict::ParamDict(in_stack_fffffffffffffa50);
  ParamDict::set((ParamDict *)&stack0xfffffffffffffa50,0,0);
  (**(code **)(**(long **)(in_RDI + 0xd0) + 0x10))
            (*(long **)(in_RDI + 0xd0),&stack0xfffffffffffffa50);
  local_5e8 = *in_RSI;
  uVar2 = in_RSI[2];
  uVar3 = in_RSI[3];
  (**(code **)(**(long **)(in_RDI + 0xd0) + 0x20))(*(long **)(in_RDI + 0xd0),&local_5e8);
  ParamDict::~ParamDict((ParamDict *)CONCAT44(uVar3,uVar2));
  return 0;
}

Assistant:

int YoloDetectionOutput::create_pipeline(const Option& opt)
{
    {
        softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

        ncnn::ParamDict pd;
        pd.set(0, 0);// axis

        softmax->load_param(pd);

        Option opt_cpu = opt;
        opt_cpu.vulkan_compute = false;
        softmax->create_pipeline(opt_cpu);
    }

    return 0;
}